

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
TransformPromiseNode<kj::_::Void,_siginfo_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++:237:29),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::_::Void,_siginfo_t,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_unix_test_c__:237:29),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  void *__src;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 in_RCX;
  char *macroArgs;
  Exception *this_00;
  char *in_R8;
  Exception *in_R9;
  ExceptionOr<siginfo_t> depResult;
  int *in_stack_fffffffffffff988;
  ExceptionOrValue local_638;
  char local_4d8;
  ExceptionOrValue local_4d0;
  char local_370;
  int local_368 [2];
  int local_360 [30];
  Exception local_2e8;
  Exception local_188;
  
  local_4d0.exception.ptr.isSet = false;
  local_370 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_4d0);
  uVar5 = local_4d0.exception.ptr.field_1.value.context.ptr.ptr;
  uVar4 = local_4d0.exception.ptr.field_1.value.description.content.size_;
  uVar3 = local_4d0.exception.ptr.field_1.value.description.content.ptr;
  uVar2 = local_4d0.exception.ptr.field_1.value.ownFile.content.size_;
  uVar1 = local_4d0.exception.ptr.field_1.value.ownFile.content.ptr;
  if (local_4d0.exception.ptr.isSet == true) {
    __src = (void *)((long)&local_4d0.exception.ptr.field_1 + 0x50);
    local_188.ownFile.content.disposer =
         local_4d0.exception.ptr.field_1.value.ownFile.content.disposer;
    local_4d0.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_4d0.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_188.file = local_4d0.exception.ptr.field_1.value.file;
    local_188.line = local_4d0.exception.ptr.field_1.value.line;
    local_188.type = local_4d0.exception.ptr.field_1.value.type;
    local_188.description.content.disposer =
         local_4d0.exception.ptr.field_1.value.description.content.disposer;
    local_4d0.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_4d0.exception.ptr.field_1.value.description.content.size_ = 0;
    local_188.context.ptr.disposer = local_4d0.exception.ptr.field_1.value.context.ptr.disposer;
    local_4d0.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_188.trace,__src,0x104);
    local_2e8.ownFile.content.disposer =
         local_4d0.exception.ptr.field_1.value.ownFile.content.disposer;
    local_188.ownFile.content.ptr = (char *)0x0;
    local_188.ownFile.content.size_ = 0;
    local_2e8.file = local_4d0.exception.ptr.field_1.value.file;
    local_2e8.line = local_4d0.exception.ptr.field_1.value.line;
    local_2e8.type = local_4d0.exception.ptr.field_1.value.type;
    local_2e8.description.content.disposer =
         local_4d0.exception.ptr.field_1.value.description.content.disposer;
    local_188.description.content.ptr = (char *)0x0;
    local_188.description.content.size_ = 0;
    local_2e8.context.ptr.disposer = local_4d0.exception.ptr.field_1.value.context.ptr.disposer;
    local_188.context.ptr.ptr = (Context *)0x0;
    memcpy(local_2e8.trace,__src,0x104);
    local_638.exception.ptr.isSet = true;
    local_638.exception.ptr.field_1.value.ownFile.content.ptr = (char *)uVar1;
    local_638.exception.ptr.field_1.value.ownFile.content.size_ = uVar2;
    local_638.exception.ptr.field_1.value.ownFile.content.disposer =
         local_4d0.exception.ptr.field_1.value.ownFile.content.disposer;
    local_2e8.ownFile.content.ptr = (char *)0x0;
    local_2e8.ownFile.content.size_ = 0;
    local_638.exception.ptr.field_1.value.file = local_4d0.exception.ptr.field_1.value.file;
    local_638.exception.ptr.field_1._32_8_ = local_4d0.exception.ptr.field_1._32_8_;
    local_638.exception.ptr.field_1.value.description.content.ptr = (char *)uVar3;
    local_638.exception.ptr.field_1.value.description.content.size_ = uVar4;
    local_638.exception.ptr.field_1.value.description.content.disposer =
         local_4d0.exception.ptr.field_1.value.description.content.disposer;
    local_2e8.description.content.ptr = (char *)0x0;
    local_2e8.description.content.size_ = 0;
    local_638.exception.ptr.field_1.value.context.ptr.disposer =
         local_4d0.exception.ptr.field_1.value.context.ptr.disposer;
    local_638.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar5;
    local_2e8.context.ptr.ptr = (Context *)0x0;
    memcpy((void *)((long)&local_638.exception.ptr.field_1 + 0x50),__src,0x104);
    local_4d8 = '\0';
    Exception::~Exception(&local_2e8);
    ExceptionOrValue::operator=(output,&local_638);
    if (&local_638 != output) {
      if (output[1].exception.ptr.isSet == true) {
        output[1].exception.ptr.isSet = false;
      }
      if (local_4d8 == '\x01') {
        output[1].exception.ptr.isSet = true;
      }
    }
    if (local_638.exception.ptr.isSet == true) {
      Exception::~Exception(&local_638.exception.ptr.field_1.value);
    }
    this_00 = &local_188;
  }
  else {
    if (local_370 != '\x01') goto LAB_001d9ff5;
    *(this->func).receivedSigio = true;
    macroArgs = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),local_368[0] != 0x1d);
    if (Debug::minSeverity < 3 && local_368[0] != 0x1d) {
      in_stack_fffffffffffff988 = local_368;
      in_R9 = &local_2e8;
      local_2e8.ownFile.content.ptr = (char *)CONCAT44(local_2e8.ownFile.content.ptr._4_4_,0x1d);
      macroArgs = "\"failed: expected \" \"(29) == (info.si_signo)\", 29, info.si_signo";
      in_R8 = "failed: expected (29) == (info.si_signo)";
      Debug::log<char_const(&)[41],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0xef,ERROR,"\"failed: expected \" \"(29) == (info.si_signo)\", 29, info.si_signo",
                 (char (*) [41])"failed: expected (29) == (info.si_signo)",(int *)in_R9,
                 in_stack_fffffffffffff988);
    }
    if ((local_360[0] != 0) && (Debug::minSeverity < 3)) {
      local_2e8.ownFile.content.ptr =
           (char *)((ulong)local_2e8.ownFile.content.ptr & 0xffffffff00000000);
      Debug::log<char_const(&)[45],__0,int&>
                ((char *)0xf0,(int)&local_2e8,(LogSeverity)local_360,macroArgs,(char (*) [45])in_R8,
                 (anon_enum_32 *)in_R9,in_stack_fffffffffffff988);
    }
    local_638.exception.ptr.isSet = false;
    local_4d8 = '\x01';
    ExceptionOrValue::operator=(output,&local_638);
    if (&local_638 != output) {
      if (output[1].exception.ptr.isSet == true) {
        output[1].exception.ptr.isSet = false;
      }
      if (local_4d8 == '\x01') {
        output[1].exception.ptr.isSet = true;
      }
    }
    if (local_638.exception.ptr.isSet != true) goto LAB_001d9ff5;
    this_00 = (Exception *)&local_638.exception.ptr.field_1;
  }
  Exception::~Exception(this_00);
LAB_001d9ff5:
  if (local_4d0.exception.ptr.isSet == true) {
    Exception::~Exception(&local_4d0.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }